

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::char_event(Application *this,uint codepoint)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  int in_ESI;
  Application *in_RDI;
  int in_stack_000000dc;
  Application *in_stack_000000e0;
  bool queued;
  Application *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  Application *in_stack_ffffffffffffff00;
  allocator *paVar1;
  undefined8 in_stack_ffffffffffffff08;
  int key;
  bool useCatmullClark;
  Application *in_stack_ffffffffffffff10;
  PathTracer *in_stack_ffffffffffffff30;
  long in_stack_ffffffffffffff38;
  PathTracer *in_stack_ffffffffffffff50;
  string local_a8 [55];
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [35];
  byte local_d;
  int local_c;
  
  key = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_d = 0;
  local_c = in_ESI;
  switch_modes(in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          (ulong)*(uint *)&(in_RDI->super_Renderer).field_0xc;
  switch(__lhs) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    in_stack_fffffffffffffef0 = (Application *)(ulong)(local_c - 0x20);
    useCatmullClark = SUB41((uint)key >> 0x18,0);
    switch(in_stack_fffffffffffffef0) {
    case (Application *)0x0:
      to_navigate_action(in_RDI);
      break;
    default:
      break;
    case (Application *)0x23:
    case (Application *)0x43:
      DynamicScene::Scene::collapse_selected_element((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x24:
    case (Application *)0x44:
      DynamicScene::Scene::downsample_selected_mesh((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x26:
    case (Application *)0x46:
      DynamicScene::Scene::flip_selected_edge((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x29:
    case (Application *)0x49:
      DynamicScene::Scene::resample_selected_mesh((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x2c:
    case (Application *)0x4c:
      queueLoad((Application *)0x26ae49);
      local_d = 1;
      break;
    case (Application *)0x2e:
    case (Application *)0x4e:
      DynamicScene::Scene::selectNextHalfedge((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x33:
      DynamicScene::Scene::subdivideSelection((Scene *)in_stack_ffffffffffffff10,useCatmullClark);
      break;
    case (Application *)0x34:
      DynamicScene::Scene::triangulateSelection((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x35:
    case (Application *)0x55:
      DynamicScene::Scene::upsample_selected_mesh((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x37:
    case (Application *)0x57:
      queueWrite((Application *)0x26ae35);
      local_d = 1;
      break;
    case (Application *)0x42:
      toggle_bevel_action(in_RDI);
      break;
    case (Application *)0x45:
      cycle_edit_action(in_stack_fffffffffffffef0);
      break;
    case (Application *)0x48:
      DynamicScene::Scene::selectHalfedge((Scene *)in_stack_ffffffffffffff10);
      break;
    case (Application *)0x50:
      DynamicScene::Scene::split_selected_edge((Scene *)in_stack_ffffffffffffff00);
      break;
    case (Application *)0x53:
      DynamicScene::Scene::subdivideSelection((Scene *)in_stack_ffffffffffffff10,useCatmullClark);
      break;
    case (Application *)0x54:
      DynamicScene::Scene::selectTwinHalfedge((Scene *)in_stack_ffffffffffffff00);
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    switch(local_c) {
    case 0x2b:
    case 0x3d:
      PathTracer::stop((PathTracer *)in_stack_ffffffffffffff00);
      PathTracer::increase_area_light_sample_count((PathTracer *)0x26ab9a);
      PathTracer::start_raytracing(in_stack_ffffffffffffff50);
      break;
    case 0x2d:
    case 0x5f:
      PathTracer::stop((PathTracer *)in_stack_ffffffffffffff00);
      PathTracer::decrease_area_light_sample_count((PathTracer *)in_stack_fffffffffffffef0);
      PathTracer::start_raytracing(in_stack_ffffffffffffff50);
      break;
    case 0x57:
    case 0x77:
      paVar1 = &local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"ScreenShot_",paVar1);
      ::time((time_t *)0x0);
      std::__cxx11::to_string(in_stack_ffffffffffffff38);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RDI);
      paVar1 = (allocator *)&stack0xffffffffffffff37;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff38,".png",paVar1);
      std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RDI);
      PathTracer::save_image(in_stack_ffffffffffffff30,__lhs);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
      std::__cxx11::string::~string(local_50);
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      break;
    case 0x5b:
    case 0x5d:
      PathTracer::key_press((PathTracer *)in_stack_ffffffffffffff10,key);
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    switch(local_c) {
    case 0x43:
    case 99:
      in_RDI->clickedJoint = (Joint *)0x0;
      toggle_create_joint_action(in_stack_fffffffffffffef0);
      break;
    case 0x50:
    case 0x70:
      to_pose_action((Application *)0x26aca5);
      break;
    case 0x53:
      in_RDI->symmetryEnabled = (bool)((in_RDI->symmetryEnabled ^ 0xffU) & 1);
      break;
    case 0x58:
      in_RDI->symmetryAxis = X;
      break;
    case 0x59:
      in_RDI->symmetryAxis = Y;
      break;
    case 0x5a:
      in_RDI->symmetryAxis = Z;
      break;
    case 0x65:
      if (in_RDI->action == Object) {
        DynamicScene::XFormWidget::cycleMode(in_RDI->scene->elementTransform);
      }
      break;
    case 0x67:
      toggleGhosted(in_stack_ffffffffffffff10);
    }
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    if (local_c == 0x20) {
      reset_camera((Application *)0x26ac08);
    }
    else {
      PathTracer::key_press((PathTracer *)in_stack_ffffffffffffff10,key);
    }
  }
  if ((local_d & 1) == 0) {
    executeFileOp(in_stack_000000e0,in_stack_000000dc);
  }
  updateWidgets(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void Application::char_event(unsigned int codepoint) {
  bool queued = false;

  switch_modes(codepoint);

  switch (mode) {
    case RENDER_MODE:
      switch (codepoint) {
        case 'w':
        case 'W':
          pathtracer->save_image(string("ScreenShot_") +
                                 string(to_string(time(NULL))) +
                                 string(".png"));
          break;
        case '+':
        case '=':
          pathtracer->stop();
          pathtracer->increase_area_light_sample_count();
          pathtracer->start_raytracing();
          break;
        case '-':
        case '_':
          pathtracer->stop();
          pathtracer->decrease_area_light_sample_count();
          pathtracer->start_raytracing();
          break;
        case '[':
        case ']':
          pathtracer->key_press(codepoint);
          break;
      }
      break;
    case VISUALIZE_MODE:
      switch (codepoint) {
        case ' ':
          reset_camera();
          break;
        default:
          pathtracer->key_press(codepoint);
      }
      break;
    case ANIMATE_MODE:
      switch (codepoint) {
        case 'c':
        case 'C':
          // 'c'reate joints
          clickedJoint = nullptr;
          toggle_create_joint_action();
          break;
        case 'e':
          if (action == Action::Object) scene->elementTransform->cycleMode();
          break;
        case 'g':
          toggleGhosted();
          break;
        case 'p':
        case 'P':
          to_pose_action();
          break;
        case 'S':
          symmetryEnabled = !symmetryEnabled;
          break;
        case 'X':
          symmetryAxis = Axis::X;
          break;
        case 'Y':
          symmetryAxis = Axis::Y;
          break;
        case 'Z':
          symmetryAxis = Axis::Z;
          break;
      }
      break;
    case MODEL_MODE:
      switch (codepoint) {
        case 'u':
        case 'U':
          scene->upsample_selected_mesh();
          break;
        case 'd':
        case 'D':
          scene->downsample_selected_mesh();
          break;
        case 'i':
        case 'I':
          // i for isotropic.
          scene->resample_selected_mesh();
          break;
        case 'f':
        case 'F':
          scene->flip_selected_edge();
          break;
        case 'p':
          scene->split_selected_edge();
          break;
        case 'c':
        case 'C':
          scene->collapse_selected_element();
          break;
        case 'n':
        case 'N':
          scene->selectNextHalfedge();
          break;
        case 't':
          scene->selectTwinHalfedge();
          break;
        case 'T':
          scene->triangulateSelection();
          break;
        case 's':
          // Catmull-Clark subdivision
          scene->subdivideSelection(true);
          break;
        case 'S':
          // linear subdivision
          scene->subdivideSelection(false);
          break;
        case 'h':
          scene->selectHalfedge();
          break;
        case ' ':
          to_navigate_action();
          break;
        case 'b':
          toggle_bevel_action();
          break;
        case 'e':
          cycle_edit_action();
          break;
        case 'w':
        case 'W':
          queueWrite();
          queued = true;
          break;
        case 'l':
        case 'L':
          queueLoad();
          queued = true;
          break;
        default:
          break;
      }
      break;
  }

  if (!queued) {
    executeFileOp(codepoint);
  }
  updateWidgets();
}